

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::ComputePipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *pPVar1;
  Parameters local_c9;
  Parameters local_c8;
  Parameters local_b0;
  allocator<char> local_69;
  string local_68;
  Parameters local_48;
  Parameters *local_20;
  Parameters *param_2_local;
  Environment *env_local;
  Resources *this_local;
  
  local_20 = param_2;
  param_2_local = (Parameters *)env;
  env_local = (Environment *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"comp",&local_69);
  ShaderModule::Parameters::Parameters(&local_48,VK_SHADER_STAGE_COMPUTE_BIT,&local_68);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->shaderModule,env,&local_48);
  ShaderModule::Parameters::~Parameters(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pPVar1 = param_2_local;
  getDescriptorSetLayout();
  PipelineLayout::Parameters::singleDescriptorSet(&local_b0,&local_c8);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,(Environment *)pPVar1,&local_b0);
  PipelineLayout::Parameters::~Parameters(&local_b0);
  DescriptorSetLayout::Parameters::~Parameters(&local_c8);
  pPVar1 = param_2_local;
  PipelineCache::Parameters::Parameters(&local_c9);
  Dependency<vkt::api::(anonymous_namespace)::PipelineCache>::Dependency
            (&this->pipelineCache,(Environment *)pPVar1,&local_c9);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: shaderModule		(env, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(getDescriptorSetLayout()))
			, pipelineCache		(env, PipelineCache::Parameters())
		{}